

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void pay_for_damage(char *dmgstr,boolean cant_mollify)

{
  char y;
  char cVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  monst *pmVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  undefined7 in_register_00000031;
  long lVar14;
  damage *pdVar15;
  bool bVar16;
  char shops_affected [5];
  char qbuf [80];
  damage *local_d0;
  uint local_c4;
  monst *local_a8;
  char local_99;
  char local_98 [4];
  undefined4 local_94;
  long local_90;
  char local_88 [88];
  
  cVar3 = u.ushops[0];
  local_94 = (undefined4)CONCAT71(in_register_00000031,cant_mollify);
  iVar4 = strcmp(dmgstr,"dig into");
  if (iVar4 == 0) {
    pcVar12 = "shop";
  }
  else {
    iVar4 = strcmp(dmgstr,"damage");
    pcVar12 = "door";
    if (iVar4 == 0) {
      pcVar12 = "shop";
    }
  }
  pdVar15 = level->damagelist;
  iVar4 = 0;
  if (pdVar15 == (damage *)0x0) {
    lVar14 = 0;
    local_d0 = (damage *)0x0;
    local_a8 = (monst *)0x0;
  }
  else {
    uVar13 = 7000;
    uVar8 = 7000;
    local_a8 = (monst *)0x0;
    local_d0 = (damage *)0x0;
    local_c4 = 7000;
    lVar14 = 0;
    do {
      if (pdVar15->when != (ulong)moves) break;
      if (pdVar15->cost != 0) {
        lVar14 = lVar14 + pdVar15->cost;
        pcVar9 = in_rooms(level,(pdVar15->place).x,(pdVar15->place).y,0x12);
        strcpy(&local_99,pcVar9);
        if (local_99 != '\0') {
          pcVar9 = local_98;
          cVar1 = local_99;
          local_90 = lVar14;
          do {
            pmVar10 = shop_keeper(level,cVar1);
            if (pmVar10 != (monst *)0x0) {
              if (pmVar10 == local_a8) {
                uVar6 = dist2((int)(pdVar15->place).x,(int)(pdVar15->place).y,(int)u.ux,(int)u.uy);
                bVar16 = uVar6 < uVar8;
                uVar8 = uVar13;
                if (bVar16) {
                  uVar8 = uVar6;
                  uVar13 = uVar6;
                  local_d0 = pdVar15;
                }
              }
              else {
                iVar5 = inhishop(pmVar10);
                if (iVar5 != 0) {
                  uVar6 = dist2((int)pmVar10->mx,(int)pmVar10->my,(int)u.ux,(int)u.uy);
                  if (uVar6 <= local_c4) {
                    iVar5 = 1;
                    if (iVar4 != 0 && uVar6 == local_c4) {
                      iVar4 = iVar4 + 1;
                      uVar7 = mt_random();
                      iVar5 = iVar4;
                      if (SUB168(ZEXT416(uVar7) % SEXT816((long)iVar4),0) != 0) goto LAB_00240818;
                    }
                    iVar4 = iVar5;
                    uVar8 = dist2((int)(pdVar15->place).x,(int)(pdVar15->place).y,(int)u.ux,
                                  (int)u.uy);
                    uVar13 = uVar8;
                    local_d0 = pdVar15;
                    local_c4 = uVar6;
                    local_a8 = pmVar10;
                  }
                }
              }
            }
LAB_00240818:
            cVar1 = *pcVar9;
            pcVar9 = pcVar9 + 1;
            lVar14 = local_90;
          } while (cVar1 != '\0');
        }
      }
      pdVar15 = pdVar15->next;
    } while (pdVar15 != (damage *)0x0);
  }
  if (lVar14 == 0) {
    return;
  }
  if (local_a8 == (monst *)0x0) {
    return;
  }
  cVar1 = (local_d0->place).x;
  y = (local_d0->place).y;
  strncpy(&local_a8[0x1b].field_0x75,plname,0x20);
  if (((local_a8->field_0x62 & 0x40) == 0) || (*(char *)((long)&local_a8[0x1b].meating + 1) != '\0')
     ) goto LAB_00240b72;
  pcVar9 = in_rooms(level,local_a8->mx,local_a8->my,0x12);
  if (*pcVar9 == '\0') {
    if ((viz_array[local_a8->my][local_a8->mx] & 2U) == 0) {
      return;
    }
LAB_00240b3c:
    pcVar9 = "How dare you %s my %s?";
  }
  else {
    if (cVar3 == '\0') {
      pmVar10 = level->monsters[cVar1][y];
      if (((pmVar10 != (monst *)0x0) && ((pmVar10->field_0x61 & 2) == 0)) && (flags.soundok != '\0')
         ) {
        You_hear("an angry voice:");
        verbalize("Out of my way, scum!");
      }
      mnearto(local_a8,cVar1,y,'\x01');
    }
    else {
      bVar2 = um_dist(local_a8->mx,local_a8->my,'\x01');
      if ((bVar2 != '\0') && (bVar2 = um_dist(local_a8->mx,local_a8->my,'\x03'), bVar2 == '\0')) {
        pline("%s leaps towards you!",(undefined1 *)((long)&local_a8[0x1c].minvent + 5));
        mnexto(local_a8);
      }
      bVar2 = um_dist(local_a8->mx,local_a8->my,'\x01');
      if (bVar2 != '\0') goto LAB_00240b3c;
    }
    bVar2 = um_dist(cVar1,y,'\x01');
    if ((((char)local_94 == '\0') && (bVar2 == '\0' || cVar3 != '\0')) &&
       ((lVar11 = money_cnt(invent), lVar14 <= (int)local_a8[0x1b].mappearance + lVar11 &&
        (uVar8 = mt_random(),
        0x51eb851 < (uVar8 * -0x3d70a3d7 >> 1 | (uint)((uVar8 * -0x3d70a3d7 & 1) != 0) << 0x1f)))))
    {
      if (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
           (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
         (u.uprops[0xd].blocked == 0)) {
        pline("Your invisibility does not fool %s!",
              (undefined1 *)((long)&local_a8[0x1c].minvent + 5));
      }
      pcVar12 = currency(lVar14);
      sprintf(local_88,"\"Cad!  You did %ld %s worth of damage!\"  Pay? ",lVar14,pcVar12);
      cVar3 = yn_function(local_88,"yn",'n');
      if (cVar3 == 'n') {
        verbalize("Oh, yes!  You\'ll pay!");
        hot_pursuit(local_a8);
        iVar4 = sgn((int)u.ualign.type);
        adjalign(-iVar4);
        return;
      }
      lVar14 = check_credit(lVar14,local_a8);
      money2mon(local_a8,lVar14);
      iflags.botl = '\x01';
      pline("Mollified, %s accepts your restitution.");
      home_shk(local_a8,'\0');
      pacify_shk(local_a8);
      return;
    }
    bVar2 = um_dist(cVar1,y,'\x01');
    if (bVar2 == '\0' || cVar3 != '\0') goto LAB_00240b3c;
    pline("%s shouts:",(undefined1 *)((long)&local_a8[0x1c].minvent + 5));
    pcVar9 = "Who dared %s my %s?";
  }
  verbalize(pcVar9,dmgstr,pcVar12);
LAB_00240b72:
  hot_pursuit(local_a8);
  return;
}

Assistant:

void pay_for_damage(const char *dmgstr, boolean cant_mollify)
{
	struct monst *shkp = NULL;
	char shops_affected[5];
	boolean uinshp = (*u.ushops != '\0');
	char qbuf[80];
	xchar x, y;
	boolean dugwall = !strcmp(dmgstr, "dig into") ||	/* wand */
			  !strcmp(dmgstr, "damage");		/* pick-axe */
	struct damage *tmp_dam, *appear_here = 0;
	/* any number >= (80*80)+(24*24) would do, actually */
	long cost_of_damage = 0L;
	unsigned int nearest_shk = 7000, nearest_damage = 7000;
	int picks = 0;

	for (tmp_dam = level->damagelist;
	     (tmp_dam && (tmp_dam->when == moves));
	     tmp_dam = tmp_dam->next) {
	    char *shp;

	    if (!tmp_dam->cost)
		continue;
	    cost_of_damage += tmp_dam->cost;
	    strcpy(shops_affected,
		   in_rooms(level, tmp_dam->place.x, tmp_dam->place.y, SHOPBASE));
	    for (shp = shops_affected; *shp; shp++) {
		struct monst *tmp_shk;
		unsigned int shk_distance;

		if (!(tmp_shk = shop_keeper(level, *shp)))
		    continue;
		if (tmp_shk == shkp) {
		    unsigned int damage_distance =
				   distu(tmp_dam->place.x, tmp_dam->place.y);

		    if (damage_distance < nearest_damage) {
			nearest_damage = damage_distance;
			appear_here = tmp_dam;
		    }
		    continue;
		}
		if (!inhishop(tmp_shk))
		    continue;
		shk_distance = distu(tmp_shk->mx, tmp_shk->my);
		if (shk_distance > nearest_shk)
		    continue;
		if ((shk_distance == nearest_shk) && picks) {
		    if (rn2(++picks))
			continue;
		} else
		    picks = 1;
		shkp = tmp_shk;
		nearest_shk = shk_distance;
		appear_here = tmp_dam;
		nearest_damage = distu(tmp_dam->place.x, tmp_dam->place.y);
	    }
	}

	if (!cost_of_damage || !shkp)
	    return;

	x = appear_here->place.x;
	y = appear_here->place.y;

	/* not the best introduction to the shk... */
	strncpy(ESHK(shkp)->customer,plname,PL_NSIZ);

	/* if the shk is already on the war path, be sure it's all out */
	if (ANGRY(shkp) || ESHK(shkp)->following) {
		hot_pursuit(shkp);
		return;
	}

	/* if the shk is not in their shop.. */
	if (!*in_rooms(level, shkp->mx,shkp->my,SHOPBASE)) {
		if (!cansee(shkp->mx, shkp->my))
			return;
		goto getcad;
	}

	if (uinshp) {
		if (um_dist(shkp->mx, shkp->my, 1) &&
			!um_dist(shkp->mx, shkp->my, 3)) {
		    pline("%s leaps towards you!", shkname(shkp));
		    mnexto(shkp);
		}
		if (um_dist(shkp->mx, shkp->my, 1)) goto getcad;
	} else {
	    /*
	     * Make shkp show up at the door.  Effect:  If there is a monster
	     * in the doorway, have the hero hear the shopkeeper yell a bit,
	     * pause, then have the shopkeeper appear at the door, having
	     * yanked the hapless critter out of the way.
	     */
	    if (MON_AT(level, x, y)) {
		if (flags.soundok) {
		    You_hear("an angry voice:");
		    verbalize("Out of my way, scum!");
		}
	    }
	    mnearto(shkp, x, y, TRUE);
	}

	if ((um_dist(x, y, 1) && !uinshp) || cant_mollify ||
	   (money_cnt(invent) + ESHK(shkp)->credit) < cost_of_damage || !rn2(50)) {
		if (um_dist(x, y, 1) && !uinshp) {
		    pline("%s shouts:", shkname(shkp));
		    verbalize("Who dared %s my %s?", dmgstr,
					 dugwall ? "shop" : "door");
		} else {
getcad:
		    verbalize("How dare you %s my %s?", dmgstr,
					 dugwall ? "shop" : "door");
		}
		hot_pursuit(shkp);
		return;
	}

	if (Invis) pline("Your invisibility does not fool %s!", shkname(shkp));
	sprintf(qbuf,"\"Cad!  You did %ld %s worth of damage!\"  Pay? ",
		 cost_of_damage, currency(cost_of_damage));
	if (yn(qbuf) != 'n') {
		cost_of_damage = check_credit(cost_of_damage, shkp);
                money2mon(shkp, cost_of_damage);
		iflags.botl = 1;
		pline("Mollified, %s accepts your restitution.",
			shkname(shkp));
		/* move shk back to his home loc */
		home_shk(shkp, FALSE);
		pacify_shk(shkp);
	} else {
		verbalize("Oh, yes!  You'll pay!");
		hot_pursuit(shkp);
		adjalign(-sgn(u.ualign.type));
	}
}